

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_12uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  
  pbVar4 = pSrc + 2;
  for (uVar3 = 0; uVar3 < (length & 0xfffffffffffffffe); uVar3 = uVar3 + 2) {
    bVar1 = pbVar4[-1];
    bVar2 = *pbVar4;
    pDst[uVar3] = (uint)(bVar1 >> 4) | (uint)pbVar4[-2] << 4;
    pDst[uVar3 + 1] = (bVar1 & 0xf) << 8 | (uint)bVar2;
    pbVar4 = pbVar4 + 3;
  }
  if ((length & 1) != 0) {
    pDst[uVar3] = (uint)(pbVar4[-1] >> 4) | (uint)pbVar4[-2] << 4;
  }
  return;
}

Assistant:

static void tif_12uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i += 2U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0xFU) << 8) | val2);
    }
    if (length & 1U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
    }
}